

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * util::ltrim(string *__return_storage_ptr__,string *str)

{
  std::__cxx11::string::find_first_not_of((char *)str,0x186ae0);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

std::string ltrim(const std::string &str)
{
	std::size_t si = str.find_first_not_of(" \t\n\r");

	if (si == std::string::npos)
	{
		si = 0;
	}
	else
	{
		--si;
	}
	++si;

	return str.substr(si);
}